

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# val_Str.cpp
# Opt level: O1

void __thiscall mbc::Val::Str::~Str(Str *this)

{
  string *psVar1;
  pointer pcVar2;
  
  (this->super__ValAtom).super_ValBase._vptr_ValBase = (_func_int **)&PTR__Str_00140948;
  if ((*(this->super__ValAtom).super_ValBase.count_ == 1) &&
     (psVar1 = this->value_, psVar1 != (string *)0x0)) {
    pcVar2 = (psVar1->_M_dataplus)._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar2 != &psVar1->field_2) {
      operator_delete(pcVar2);
    }
    operator_delete(psVar1);
  }
  _ValAtom::~_ValAtom(&this->super__ValAtom);
  return;
}

Assistant:

Str::~Str() {
    if(*count_ == 1) {
        delete value_;
    }
}